

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

void __thiscall smf::MidiFile::joinTracks(MidiFile *this)

{
  pointer *pppMVar1;
  MidiEventList *this_00;
  iterator __position;
  int iVar2;
  int iVar3;
  MidiEventList *this_01;
  MidiEvent *event;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  MidiEventList *joinedTrack;
  MidiEventList *local_38;
  
  if (this->m_theTrackState != 1) {
    if (((long)(this->m_events).
               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->m_events).
               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
               _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 8) {
      this_01 = (MidiEventList *)operator_new(0x18);
      MidiEventList::MidiEventList(this_01);
      uVar6 = (uint)((ulong)((long)(this->m_events).
                                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_38 = this_01;
      if ((int)uVar6 < 1) {
        iVar5 = 0;
      }
      else {
        uVar4 = 0;
        iVar5 = 0;
        do {
          iVar2 = MidiEventList::size((this->m_events).
                                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar4]);
          iVar5 = iVar5 + iVar2;
          uVar4 = uVar4 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar4);
      }
      MidiEventList::reserve(this_01,(int)((double)iVar5 * 0.1 + (double)(iVar5 + 0x20)));
      iVar5 = this->m_theTimeState;
      if (iVar5 == 0) {
        makeAbsoluteTicks(this);
      }
      if (0 < (int)uVar6) {
        uVar4 = 0;
        do {
          iVar2 = MidiEventList::size((this->m_events).
                                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar4]);
          if (0 < iVar2) {
            iVar2 = 0;
            do {
              event = MidiEventList::operator[]
                                ((this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar4],iVar2);
              MidiEventList::push_back_no_copy(this_01,event);
              iVar2 = iVar2 + 1;
              iVar3 = MidiEventList::size((this->m_events).
                                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar4]);
            } while (iVar2 < iVar3);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != (uVar6 & 0x7fffffff));
      }
      clear_no_deallocate(this);
      this_00 = *(this->m_events).
                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (this_00 != (MidiEventList *)0x0) {
        MidiEventList::~MidiEventList(this_00);
      }
      operator_delete(this_00);
      std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                (&this->m_events,0);
      __position._M_current =
           (this->m_events).
           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_events).
          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<smf::MidiEventList*,std::allocator<smf::MidiEventList*>>::
        _M_realloc_insert<smf::MidiEventList*const&>
                  ((vector<smf::MidiEventList*,std::allocator<smf::MidiEventList*>> *)this,
                   __position,&local_38);
      }
      else {
        *__position._M_current = this_01;
        pppMVar1 = &(this->m_events).
                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppMVar1 = *pppMVar1 + 1;
      }
      sortTracksNoteOnsBeforeOffs(this);
      if (iVar5 == 0) {
        makeDeltaTicks(this);
      }
    }
    this->m_theTrackState = 1;
  }
  return;
}

Assistant:

void MidiFile::joinTracks(void) {
	if (getTrackState() == TRACK_STATE_JOINED) {
		return;
	}
	if (getNumTracks() == 1) {
		m_theTrackState = TRACK_STATE_JOINED;
		return;
	}

	MidiEventList* joinedTrack;
	joinedTrack = new MidiEventList;

	int messagesum = 0;
	int length = getNumTracks();
	int i, j;
	for (i=0; i<length; i++) {
		messagesum += (*m_events[i]).size();
	}
	joinedTrack->reserve((int)(messagesum + 32 + messagesum * 0.1));

	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}
	for (i=0; i<length; i++) {
		for (j=0; j<(int)m_events[i]->size(); j++) {
			joinedTrack->push_back_no_copy(&(*m_events[i])[j]);
		}
	}

	clear_no_deallocate();

	delete m_events[0];
	m_events.resize(0);
	m_events.push_back(joinedTrack);
	sortTracks();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeDeltaTicks();
	}

	m_theTrackState = TRACK_STATE_JOINED;
}